

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_iter(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint __fd;
  int iVar4;
  char *__buf;
  char *__n;
  undefined8 uVar5;
  void *pvVar6;
  void *__s2;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  DIR *__dirp;
  dirent *pdVar11;
  FILE *__stream;
  long lVar12;
  undefined8 uVar13;
  uint extraout_EDX;
  ulong uVar14;
  char *__dest;
  char *pcVar15;
  ulong uVar16;
  DIR *__s;
  DIR *__name;
  char *pcVar17;
  DIR *pDVar18;
  DIR *__filename;
  undefined8 uVar19;
  char *unaff_R12;
  DIR *pDVar20;
  char *unaff_R13;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  bson_iter_t iter;
  undefined1 auStack_6d98 [8];
  undefined1 auStack_6d90 [504];
  ulong uStack_6b98;
  DIR *pDStack_6b90;
  char *pcStack_6b88;
  DIR *pDStack_6b80;
  DIR *pDStack_6b78;
  int iStack_6b6c;
  DIR *pDStack_6b68;
  stat sStack_6b60;
  char acStack_6ad0 [512];
  size_t sStack_68d0;
  char *pcStack_68c8;
  DIR *pDStack_68c0;
  char *pcStack_68b8;
  code *pcStack_68b0;
  char *pcStack_68a8;
  ulong uStack_68a0;
  char *pcStack_6898;
  DIR *pDStack_6890;
  undefined8 *puStack_6888;
  undefined8 uStack_6850;
  undefined1 *puStack_6848;
  undefined1 *puStack_6840;
  undefined1 auStack_6830 [8];
  char *pcStack_6828;
  undefined8 uStack_6818;
  char *pcStack_6810;
  undefined8 uStack_6808;
  undefined8 uStack_67f0;
  DIR aDStack_6780 [25944];
  char *pcStack_228;
  char *pcStack_220;
  char *pcStack_218;
  char *pcStack_210;
  code *apcStack_208 [2];
  undefined1 auStack_1f8 [116];
  uint local_184;
  char local_180 [336];
  
  apcStack_208[0] = (code *)0x13c8be;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_208[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_208[0] = (code *)0x13c8ed;
  uVar5 = bson_bcone_magic();
  pcVar7 = local_180;
  pcVar15 = "foo";
  uVar13 = 0x1d;
  uVar19 = 0;
  apcStack_208[0] = (code *)0x13c90d;
  pcVar17 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar5);
  uVar5 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_208[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_208[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_208[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_208[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_208[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar17 = local_180;
    apcStack_208[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar5 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar17 = local_180;
    apcStack_208[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar5 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar19 = 0;
    apcStack_208[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,local_180);
    apcStack_208[0] = (code *)0x13c96f;
    unaff_R12 = (char *)bson_get_data(__n_00);
    apcStack_208[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_208[0] = (code *)0x13c98e;
      pvVar6 = (void *)bson_get_data(__n);
      apcStack_208[0] = (code *)0x13c999;
      __s2 = (void *)bson_get_data(__n_00);
      apcStack_208[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar6,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_208[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_208[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_208[0] = (code *)0x13c9d4;
    uVar13 = bson_as_canonical_extended_json(__n_00);
    apcStack_208[0] = (code *)0x13c9e1;
    pcVar7 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar14 = 0xffffffff;
    if (uVar3 != 0) {
      uVar16 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar16) break;
        if (unaff_R12[uVar16] != __buf[uVar16]) {
          uVar14 = uVar16 & 0xffffffff;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar3 != (uint)uVar16);
    }
    if ((int)uVar14 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar14 = (ulong)(uVar3 - 1);
    }
    apcStack_208[0] = (code *)0x13ca3c;
    uVar5 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14);
    apcStack_208[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R13 = (char *)(ulong)uVar3;
    pcVar17 = "failure.expected.bson";
    pcVar15 = (char *)0x42;
    apcStack_208[0] = (code *)0x13ca6f;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    local_184 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (__fd == 0xffffffff) goto LAB_0013cad0;
    unaff_R13 = (char *)(ulong)__fd;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar17 = (char *)(ulong)uVar3;
    apcStack_208[0] = (code *)0x13ca95;
    pcVar15 = unaff_R12;
    pcVar8 = (char *)write(uVar3,unaff_R12,(size_t)__n_00);
    if (pcVar8 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_208[0] = (code *)0x13caab;
      pcVar15 = __buf;
      pcVar17 = unaff_R13;
      pcVar8 = (char *)write(__fd,__buf,(size_t)__n);
      if (pcVar8 != __n) goto LAB_0013cada;
      pcVar17 = (char *)(ulong)local_184;
      pcVar15 = (char *)(ulong)__fd;
      apcStack_208[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_208[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_208[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6840 = auStack_6830;
  if (extraout_AL != '\0') {
    uStack_67f0 = uVar5;
  }
  puStack_6888 = (undefined8 *)0x13cb62;
  pcStack_6828 = pcVar15;
  uStack_6818 = uVar13;
  pcStack_6810 = pcVar7;
  uStack_6808 = uVar19;
  pcStack_228 = __n;
  pcStack_220 = unaff_R12;
  pcStack_218 = __buf;
  pcStack_210 = __n_00;
  apcStack_208[0] = (code *)&stack0xfffffffffffffff8;
  bcon_extract_ctx_init(aDStack_6780);
  puStack_6848 = auStack_1f8;
  uStack_6850 = 0x3000000010;
  uVar5 = 0x10;
  if (0 < (int)(uint)pcStack_6828) {
    uVar3 = (uint)pcStack_6828;
    do {
      puStack_6888 = (undefined8 *)0x13cbce;
      __s = aDStack_6780;
      pcVar7 = pcVar17;
      cVar1 = bcon_extract_ctx_va(pcVar17,aDStack_6780,&uStack_6850);
      iVar2 = (int)uVar5;
      if (cVar1 == '\0') {
        puStack_6888 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_68b0 = (code *)0x13cc03;
        __name = __s;
        pcStack_68a8 = pcVar17;
        uStack_68a0 = (ulong)uVar3;
        pcStack_6898 = unaff_R13;
        pDStack_6890 = aDStack_6780;
        puStack_6888 = &uStack_6850;
        pcVar17 = (char *)strlen(pcVar7);
        pcStack_68b0 = (code *)0x13cc0e;
        pDVar18 = __s;
        sVar9 = strlen((char *)__s);
        if ((int)sVar9 + (int)pcVar17 < 499) {
          pcStack_68b0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_68b0 = (code *)0x13cc38;
          strncat(__dest,pcVar7,(long)(int)pcVar17);
          pcStack_68b0 = (code *)0x13cc40;
          sVar10 = strlen(__dest);
          (__dest + sVar10)[0] = '/';
          (__dest + sVar10)[1] = '\0';
          pcStack_68b0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar9);
          pcVar7 = __dest;
          do {
            if (*pcVar7 == '\\') {
              *pcVar7 = '/';
            }
            else if (*pcVar7 == '\0') {
              return;
            }
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        pcStack_68b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar14 = (ulong)extraout_EDX;
        pDStack_6b78 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_6b6c = iVar2;
        sStack_68d0 = sVar9;
        pcStack_68c8 = pcVar17;
        pDStack_68c0 = __s;
        pcStack_68b8 = pcVar7;
        pcStack_68b0 = (code *)apcStack_208;
        __dirp = opendir((char *)__name);
        pDVar20 = pDVar18;
        pDStack_6b80 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_6b78 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar11 = readdir(__dirp);
        if (pdVar11 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar17 = "..";
        pDVar20 = (DIR *)0x147699;
        pDStack_6b68 = pDVar18;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_6b78 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar7,acStack_6ad0);
  pDStack_6b78 = (DIR *)0x13cd32;
  iVar4 = stat(pcVar7,&sStack_6b60);
  if ((iVar4 == 0) && ((sStack_6b60.st_mode & 0xf000) == 0x4000)) {
    pDStack_6b78 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_6b68,acStack_6ad0,iVar2,iStack_6b6c);
    uVar14 = (ulong)uVar3;
  }
  else {
    pDStack_6b78 = (DIR *)0x13cd73;
    pcVar15 = strstr(pcVar7,".json");
    if (pcVar15 != (char *)0x0) {
      uVar14 = (ulong)(iVar2 + 1);
      pDStack_6b78 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar7,(char *)(pDStack_6b68 + (long)iVar2 * 500));
    }
  }
  pDStack_6b78 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar11 = readdir(__dirp);
  if (pdVar11 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_6b78 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar14;
  if (iVar2 < iStack_6b6c) {
    do {
      pcVar7 = pdVar11->d_name;
      pDStack_6b78 = (DIR *)0x13ccea;
      iVar4 = strcmp(pcVar7,"..");
      if (iVar4 != 0) {
        pDStack_6b78 = (DIR *)0x13ccf9;
        iVar4 = strcmp(pcVar7,".");
        if (iVar4 != 0) goto LAB_0013cd12;
      }
      pDStack_6b78 = (DIR *)0x13cd05;
      pdVar11 = readdir(__dirp);
      if (pdVar11 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_6b78 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_6b80 = __dirp;
LAB_0013cdc9:
  pDStack_6b78 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_6b98 = uVar14;
  pDStack_6b90 = pDVar20;
  pcStack_6b88 = pcVar17;
  pDStack_6b78 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar9 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar9) {
      pvVar6 = (void *)bson_malloc0(sVar9);
      sVar10 = fread(pvVar6,1,sVar9,__stream);
      if (sVar10 != sVar9) {
        abort();
      }
      fclose(__stream);
      if (pvVar6 != (void *)0x0) {
        lVar12 = bson_new_from_json(pvVar6,sVar9,auStack_6d98);
        if (lVar12 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6d90);
          abort();
        }
        bson_free(pvVar6);
      }
    }
  }
  return;
}

Assistant:

static void
test_iter (void)
{
   bson_t bcon, expected;
   bson_iter_t iter;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_int32 (&expected, "foo", -1, 100);
   bson_iter_init_find (&iter, &expected, "foo");

   BCON_APPEND (&bcon, "foo", BCON_ITER (&iter));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}